

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonRemoveAllNulls(JsonNode *pNode)

{
  u32 uVar1;
  u32 uVar2;
  int local_14;
  int n;
  int i;
  JsonNode *pNode_local;
  
  uVar1 = pNode->n;
  for (local_14 = 2; local_14 <= (int)uVar1; local_14 = uVar2 + 1 + local_14) {
    if (pNode[local_14].eType == '\0') {
      pNode[local_14].jnFlags = pNode[local_14].jnFlags | 4;
    }
    else if (pNode[local_14].eType == '\a') {
      jsonRemoveAllNulls(pNode + local_14);
    }
    uVar2 = jsonNodeSize(pNode + local_14);
  }
  return;
}

Assistant:

static void jsonRemoveAllNulls(JsonNode *pNode){
  int i, n;
  assert( pNode->eType==JSON_OBJECT );
  n = pNode->n;
  for(i=2; i<=n; i += jsonNodeSize(&pNode[i])+1){
    switch( pNode[i].eType ){
      case JSON_NULL:
        pNode[i].jnFlags |= JNODE_REMOVE;
        break;
      case JSON_OBJECT:
        jsonRemoveAllNulls(&pNode[i]);
        break;
    }
  }
}